

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O0

char * err_get_msg(err_msg_t *msg_array,size_t msg_count,int msgnum,int verbose)

{
  int local_40;
  int local_3c;
  char *local_38;
  int cur;
  int lo;
  int hi;
  int verbose_local;
  int msgnum_local;
  size_t msg_count_local;
  err_msg_t *msg_array_local;
  
  lo = 0;
  hi = (int)msg_count + -1;
  while( true ) {
    if (hi < lo) {
      return (char *)0x0;
    }
    local_40 = lo + (hi - lo) / 2;
    if (msg_array[local_40].msgnum == msgnum) break;
    if (msg_array[local_40].msgnum < msgnum) {
      local_3c = local_40;
      if (local_40 == lo) {
        local_3c = local_40 + 1;
      }
      lo = local_3c;
    }
    else {
      if (local_40 == hi) {
        local_40 = local_40 + -1;
      }
      hi = local_40;
    }
  }
  if (verbose == 0) {
    local_38 = msg_array[local_40].short_msgtxt;
  }
  else {
    local_38 = msg_array[local_40].long_msgtxt;
  }
  return local_38;
}

Assistant:

const char *err_get_msg(const err_msg_t *msg_array, size_t msg_count,
                        int msgnum, int verbose)
{
    int hi, lo, cur;

    /* perform a binary search of the message list */
    lo = 0;
    hi = msg_count - 1;
    while (lo <= hi)
    {
        /* split the difference */
        cur = lo + (hi - lo)/2;

        /* is it a match? */
        if (msg_array[cur].msgnum == msgnum)
        {
            /* it's the one - return the text */
            return (verbose
                    ? msg_array[cur].long_msgtxt
                    : msg_array[cur].short_msgtxt);
        }
        else if (msgnum > msg_array[cur].msgnum)
        {
            /* we need to go higher */
            lo = (cur == lo ? cur + 1 : cur);
        }
        else
        {
            /* we need to go lower */
            hi = (cur == hi ? cur - 1 : cur);
        }
    }

    /* no such message */
    return 0;
}